

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall
ON_StandardDisplayModeId::IsStandardDisplayModeId(ON_StandardDisplayModeId *this,ON_UUID id)

{
  bool bVar1;
  ON_StandardDisplayModeId *local_1c;
  ON_UUID id_local;
  
  id_local._0_8_ = id._0_8_;
  local_1c = this;
  bVar1 = ::operator==(&Wireframe,(ON_UUID_struct *)&local_1c);
  if (bVar1) {
    id_local.Data4[3] = '\x01';
  }
  else {
    bVar1 = ::operator==(&Shaded,(ON_UUID_struct *)&local_1c);
    if (bVar1) {
      id_local.Data4[3] = '\x01';
    }
    else {
      bVar1 = ::operator==(&Rendered,(ON_UUID_struct *)&local_1c);
      if (bVar1) {
        id_local.Data4[3] = '\x01';
      }
      else {
        bVar1 = ::operator==(&Ghosted,(ON_UUID_struct *)&local_1c);
        if (bVar1) {
          id_local.Data4[3] = '\x01';
        }
        else {
          bVar1 = ::operator==(&XrayShade,(ON_UUID_struct *)&local_1c);
          if (bVar1) {
            id_local.Data4[3] = '\x01';
          }
          else {
            bVar1 = ::operator==(&RenderedShadows,(ON_UUID_struct *)&local_1c);
            if (bVar1) {
              id_local.Data4[3] = '\x01';
            }
            else {
              bVar1 = ::operator==(&Technical,(ON_UUID_struct *)&local_1c);
              if (bVar1) {
                id_local.Data4[3] = '\x01';
              }
              else {
                bVar1 = ::operator==(&Artistic,(ON_UUID_struct *)&local_1c);
                if (bVar1) {
                  id_local.Data4[3] = '\x01';
                }
                else {
                  bVar1 = ::operator==(&Pen,(ON_UUID_struct *)&local_1c);
                  if (bVar1) {
                    id_local.Data4[3] = '\x01';
                  }
                  else {
                    bVar1 = ::operator==(&Monochrome,(ON_UUID_struct *)&local_1c);
                    if (bVar1) {
                      id_local.Data4[3] = '\x01';
                    }
                    else {
                      bVar1 = ::operator==(&AmbientOcclusion,(ON_UUID_struct *)&local_1c);
                      if (bVar1) {
                        id_local.Data4[3] = '\x01';
                      }
                      else {
                        bVar1 = ::operator==(&Raytraced,(ON_UUID_struct *)&local_1c);
                        if (bVar1) {
                          id_local.Data4[3] = '\x01';
                        }
                        else {
                          id_local.Data4[3] = '\0';
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)id_local.Data4[3];
}

Assistant:

bool ON_StandardDisplayModeId::IsStandardDisplayModeId(
    ON_UUID id
    )
{
  if ( ON_StandardDisplayModeId::Wireframe == id )
    return true;
  if ( ON_StandardDisplayModeId::Shaded == id )
    return true;
  if ( ON_StandardDisplayModeId::Rendered == id )
    return true;
  if ( ON_StandardDisplayModeId::Ghosted == id )
    return true;
  if ( ON_StandardDisplayModeId::XrayShade == id )
    return true;
  if ( ON_StandardDisplayModeId::RenderedShadows == id )
    return true;
  if ( ON_StandardDisplayModeId::Technical == id )
    return true;
  if ( ON_StandardDisplayModeId::Artistic == id )
    return true;
  if ( ON_StandardDisplayModeId::Pen == id )
    return true;
  if (ON_StandardDisplayModeId::Monochrome == id)
    return true;
  if ( ON_StandardDisplayModeId::AmbientOcclusion == id)
    return true;
  if ( ON_StandardDisplayModeId::Raytraced == id)
    return true;

  return false;
}